

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

void __thiscall Datatype::printRaw(Datatype *this,ostream *s)

{
  long lVar1;
  ostream *this_00;
  void *this_01;
  ostream *s_local;
  Datatype *this_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    this_00 = std::operator<<(s,"unkbyte");
    this_01 = (void *)std::ostream::operator<<(this_00,std::dec);
    std::ostream::operator<<(this_01,this->size);
  }
  else {
    std::operator<<(s,(string *)&this->name);
  }
  return;
}

Assistant:

void Datatype::printRaw(ostream &s) const

{
  if (name.size()>0)
    s << name;
  else
    s << "unkbyte" << dec << size;
}